

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O0

JL_STATUS JlAddNumberU64ToDictionaryObject
                    (JlDataObject *DictionaryObject,char *KeyName,uint64_t NumberU64)

{
  JlDataObject *local_30;
  JlDataObject *numberObject;
  uint64_t uStack_20;
  JL_STATUS jlStatus;
  uint64_t NumberU64_local;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  local_30 = (JlDataObject *)0x0;
  if ((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) {
    numberObject._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    uStack_20 = NumberU64;
    NumberU64_local = (uint64_t)KeyName;
    KeyName_local = (char *)DictionaryObject;
    numberObject._4_4_ = JlCreateNumberU64Object(NumberU64,&local_30);
    if ((numberObject._4_4_ == JL_STATUS_SUCCESS) &&
       (numberObject._4_4_ =
             JlAttachObjectToDictionaryObject
                       ((JlDataObject *)KeyName_local,(char *)NumberU64_local,local_30),
       numberObject._4_4_ != JL_STATUS_SUCCESS)) {
      JlFreeObjectTree(&local_30);
    }
  }
  return numberObject._4_4_;
}

Assistant:

JL_STATUS
    JlAddNumberU64ToDictionaryObject
    (
        JlDataObject*       DictionaryObject,   // [in,out]
        char const*         KeyName,            // [in]
        uint64_t            NumberU64           // [in]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* numberObject = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName )
    {
        jlStatus = JlCreateNumberU64Object( NumberU64, &numberObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, KeyName, numberObject );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                (void) JlFreeObjectTree( &numberObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}